

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSaveSettings(ImGuiTable *table)

{
  float fVar1;
  uint uVar2;
  char *pcVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiTableSettings *pIVar6;
  long lVar7;
  ImGuiTableColumn *pIVar8;
  ImGuiTableSettings *pIVar9;
  bool bVar10;
  int iVar11;
  byte bVar12;
  byte bVar13;
  ImGuiContext *g;
  bool bVar14;
  float fVar15;
  
  table->IsSettingsDirty = false;
  pIVar4 = GImGui;
  if ((table->Flags & 0x10) != 0) {
    return;
  }
  lVar7 = (long)table->SettingsOffset;
  if (lVar7 == -1) {
    iVar11 = table->ColumnsCount;
  }
  else {
    pcVar3 = (GImGui->SettingsTables).Buf.Data;
    pIVar6 = (ImGuiTableSettings *)(pcVar3 + lVar7);
    iVar11 = table->ColumnsCount;
    if (iVar11 <= pcVar3[lVar7 + 0xd]) goto LAB_00154f48;
    pIVar6->ID = 0;
  }
  pIVar6 = TableSettingsCreate(table->ID,iVar11);
  table->SettingsOffset = (int)pIVar6 - *(int *)&(pIVar4->SettingsTables).Buf.Data;
  iVar11 = table->ColumnsCount;
LAB_00154f48:
  pIVar6->ColumnsCount = (ImGuiTableColumnIdx)iVar11;
  pIVar8 = (table->Columns).Data;
  pIVar6->SaveFlags = 0;
  fVar15 = 0.0;
  if (0 < iVar11) {
    pIVar9 = pIVar6 + 1;
    iVar11 = 0;
    bVar5 = false;
    do {
      bVar10 = bVar5;
      fVar1 = *(float *)((long)&pIVar8->WidthRequest + (ulong)(pIVar8->Flags & 8));
      pIVar9->ID = (ImGuiID)fVar1;
      *(char *)&pIVar9->RefScale = (char)iVar11;
      *(ImGuiTableColumnIdx *)((long)&pIVar9->RefScale + 1) = pIVar8->DisplayOrder;
      *(ImGuiTableColumnIdx *)((long)&pIVar9->RefScale + 2) = pIVar8->SortOrder;
      bVar12 = pIVar8->field_0x65 & 3;
      bVar13 = *(byte *)((long)&pIVar9->RefScale + 3);
      *(byte *)((long)&pIVar9->RefScale + 3) = bVar13 & 0xfc | bVar12;
      bVar13 = bVar13 & 0xf8 | bVar12 | pIVar8->IsUserEnabled << 2;
      *(byte *)((long)&pIVar9->RefScale + 3) = bVar13;
      *(byte *)((long)&pIVar9->RefScale + 3) = bVar13 & 0xf7 | (byte)pIVar8->Flags & 8;
      uVar2 = pIVar8->Flags;
      bVar14 = (uVar2 & 8) == 0;
      if ((fVar1 != pIVar8->InitStretchWeightOrWidth) ||
         (NAN(fVar1) || NAN(pIVar8->InitStretchWeightOrWidth))) {
        *(byte *)&pIVar6->SaveFlags = (byte)pIVar6->SaveFlags | 1;
      }
      if (iVar11 != pIVar8->DisplayOrder) {
        *(byte *)&pIVar6->SaveFlags = (byte)pIVar6->SaveFlags | 2;
      }
      if (pIVar8->SortOrder != -1) {
        *(byte *)&pIVar6->SaveFlags = (byte)pIVar6->SaveFlags | 8;
      }
      if ((uVar2 >> 1 & 1) == (uint)pIVar8->IsUserEnabled) {
        *(byte *)&pIVar6->SaveFlags = (byte)pIVar6->SaveFlags | 4;
      }
      iVar11 = iVar11 + 1;
      pIVar8 = pIVar8 + 1;
      pIVar9 = (ImGuiTableSettings *)&pIVar9->ColumnsCount;
      bVar5 = (bool)(bVar10 | bVar14);
    } while (iVar11 < table->ColumnsCount);
    pIVar6->SaveFlags = pIVar6->SaveFlags & table->Flags;
    if (bVar10 || bVar14) {
      fVar15 = table->RefScale;
    }
  }
  pIVar6->RefScale = fVar15;
  MarkIniSettingsDirty();
  return;
}

Assistant:

void ImGui::TableSaveSettings(ImGuiTable* table)
{
    table->IsSettingsDirty = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind or create settings data
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = TableGetBoundSettings(table);
    if (settings == NULL)
    {
        settings = TableSettingsCreate(table->ID, table->ColumnsCount);
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    settings->ColumnsCount = (ImGuiTableColumnIdx)table->ColumnsCount;

    // Serialize ImGuiTable/ImGuiTableColumn into ImGuiTableSettings/ImGuiTableColumnSettings
    IM_ASSERT(settings->ID == table->ID);
    IM_ASSERT(settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount);
    ImGuiTableColumn* column = table->Columns.Data;
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();

    bool save_ref_scale = false;
    settings->SaveFlags = ImGuiTableFlags_None;
    for (int n = 0; n < table->ColumnsCount; n++, column++, column_settings++)
    {
        const float width_or_weight = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? column->StretchWeight : column->WidthRequest;
        column_settings->WidthOrWeight = width_or_weight;
        column_settings->Index = (ImGuiTableColumnIdx)n;
        column_settings->DisplayOrder = column->DisplayOrder;
        column_settings->SortOrder = column->SortOrder;
        column_settings->SortDirection = column->SortDirection;
        column_settings->IsEnabled = column->IsUserEnabled;
        column_settings->IsStretch = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? 1 : 0;
        if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) == 0)
            save_ref_scale = true;

        // We skip saving some data in the .ini file when they are unnecessary to restore our state.
        // Note that fixed width where initial width was derived from auto-fit will always be saved as InitStretchWeightOrWidth will be 0.0f.
        // FIXME-TABLE: We don't have logic to easily compare SortOrder to DefaultSortOrder yet so it's always saved when present.
        if (width_or_weight != column->InitStretchWeightOrWidth)
            settings->SaveFlags |= ImGuiTableFlags_Resizable;
        if (column->DisplayOrder != n)
            settings->SaveFlags |= ImGuiTableFlags_Reorderable;
        if (column->SortOrder != -1)
            settings->SaveFlags |= ImGuiTableFlags_Sortable;
        if (column->IsUserEnabled != ((column->Flags & ImGuiTableColumnFlags_DefaultHide) == 0))
            settings->SaveFlags |= ImGuiTableFlags_Hideable;
    }
    settings->SaveFlags &= table->Flags;
    settings->RefScale = save_ref_scale ? table->RefScale : 0.0f;

    MarkIniSettingsDirty();
}